

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction
          (ParquetKeyValueMetadataFunction *this)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_5a;
  allocator local_59;
  LogicalType local_58 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  string local_28 [32];
  
  std::__cxx11::string::string(local_28,"parquet_kv_metadata",&local_59);
  duckdb::LogicalType::LogicalType(local_58,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_58;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_5a);
  duckdb::TableFunction::TableFunction
            (&this->super_TableFunction,local_28,&local_40,
             ParquetMetaDataImplementation<(duckdb::ParquetMetadataOperatorType)2>,
             ParquetMetaDataBind<(duckdb::ParquetMetadataOperatorType)2>,
             ParquetMetaDataInit<(duckdb::ParquetMetadataOperatorType)2>,0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  duckdb::LogicalType::~LogicalType(local_58);
  std::__cxx11::string::~string(local_28);
  *(undefined ***)&this->super_TableFunction = &PTR__TableFunction_004db7e0;
  return;
}

Assistant:

ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction()
    : TableFunction("parquet_kv_metadata", {LogicalType::VARCHAR},
                    ParquetMetaDataImplementation<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>,
                    ParquetMetaDataBind<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>,
                    ParquetMetaDataInit<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>) {
}